

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O2

void __thiscall absl::lts_20240722::FlagSaver::~FlagSaver(FlagSaver *this)

{
  FlagSaverImpl *this_00;
  
  if (this->impl_ != (FlagSaverImpl *)0x0) {
    flags_internal::FlagSaverImpl::RestoreToRegistry(this->impl_);
    this_00 = this->impl_;
    if (this_00 != (FlagSaverImpl *)0x0) {
      std::
      vector<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>,_std::allocator<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>_>_>
      ::~vector(&this_00->backup_registry_);
    }
    operator_delete(this_00,0x18);
    return;
  }
  return;
}

Assistant:

FlagSaver::~FlagSaver() {
  if (!impl_) return;

  impl_->RestoreToRegistry();
  delete impl_;
}